

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::NetDeclarationSyntax::NetDeclarationSyntax
          (NetDeclarationSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes
          ,Token netType,NetStrengthSyntax *strength,Token expansionHint,DataTypeSyntax *type,
          TimingControlSyntax *delay,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,Token semi)

{
  size_t sVar1;
  pointer ppAVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar6 = netType._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.kind = NetDeclaration;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (attributes->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f7698;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          ._M_extent._M_extent_value;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       _M_ptr;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f75e8;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar8 = 0;
    do {
      *(NetDeclarationSyntax **)(*(long *)((long)ppAVar2 + lVar8) + 8) = this;
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  (this->netType).kind = (short)uVar6;
  (this->netType).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->netType).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->netType).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->netType).info = netType.info;
  this->strength = strength;
  (this->expansionHint).kind = expansionHint.kind;
  (this->expansionHint).field_0x2 = expansionHint._2_1_;
  (this->expansionHint).numFlags = (NumericTokenFlags)expansionHint.numFlags.raw;
  (this->expansionHint).rawLen = expansionHint.rawLen;
  (this->expansionHint).info = expansionHint.info;
  (this->type).ptr = type;
  this->delay = delay;
  uVar4 = *(undefined4 *)&(declarators->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (declarators->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.kind =
       (declarators->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (declarators->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->declarators).super_SyntaxListBase.childCount =
       (declarators->super_SyntaxListBase).childCount;
  (this->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f8020;
  sVar1 = (declarators->elements)._M_extent._M_extent_value;
  (this->declarators).elements._M_ptr = (declarators->elements)._M_ptr;
  (this->declarators).elements._M_extent._M_extent_value = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  if (strength != (NetStrengthSyntax *)0x0) {
    (strength->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (type->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  if (delay != (TimingControlSyntax *)0x0) {
    (delay->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar7 = (this->declarators).elements._M_extent._M_extent_value + 1;
  if (1 < uVar7) {
    uVar7 = uVar7 >> 1;
    lVar8 = 0;
    do {
      ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->declarators).elements._M_ptr)->super_ConstTokenOrSyntax)
                                   .
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar8));
      (*ppSVar5)->parent = (SyntaxNode *)this;
      lVar8 = lVar8 + 0x30;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

NetDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token netType, NetStrengthSyntax* strength, Token expansionHint, DataTypeSyntax& type, TimingControlSyntax* delay, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        MemberSyntax(SyntaxKind::NetDeclaration, attributes), netType(netType), strength(strength), expansionHint(expansionHint), type(&type), delay(delay), declarators(declarators), semi(semi) {
        if (this->strength) this->strength->parent = this;
        this->type->parent = this;
        if (this->delay) this->delay->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }